

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi)

{
  byte bVar1;
  PaUtilAllocationGroup *pPVar2;
  char *__s2;
  long lVar3;
  long lVar4;
  snd_ctl_t *psVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  byte *pbVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined8 uVar18;
  char *pcVar19;
  pthread_t __thread1;
  PaDeviceInfo **ppPVar20;
  PaAlsaDeviceInfo *devInfo;
  PaAlsaHostApiRepresentation *pPVar21;
  char *pcVar22;
  char *pcVar23;
  byte *pbVar24;
  byte *pbVar25;
  int __pa_unsure_error_id;
  HwDevInfo *pHVar26;
  HwDevInfo *deviceHwInfo;
  snd_ctl_t *psVar27;
  PaAlsaDeviceInfo *devInfo_00;
  bool bVar28;
  undefined8 uStack_140;
  char local_138 [8];
  char alsaCardName [50];
  char *local_f8;
  char buf [50];
  char *local_b8;
  char *alsaDeviceName;
  char *local_a8;
  undefined8 local_a0;
  snd_config_t *topNode;
  snd_ctl_t *local_90;
  char *local_88;
  int local_80;
  uint local_7c;
  int cardIdx;
  char *cardName;
  snd_ctl_t *ctl;
  int local_60;
  int local_5c;
  int devIdx;
  int devIdx_1;
  PaAlsaHostApiRepresentation *local_50;
  HwDevInfo *local_48;
  snd_ctl_t *local_40;
  ulong local_38;
  
  local_80 = -1;
  local_60 = 0;
  local_a0 = 0;
  uStack_140 = 0x10a83f;
  pcVar11 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar11 == (char *)0x0) {
    local_7c = 1;
  }
  else {
    uStack_140 = 0x10a84c;
    iVar7 = atoi(pcVar11);
    local_7c = (uint)(iVar7 == 0);
  }
  uStack_140 = 0x10a86b;
  pcVar11 = getenv("PA_ALSA_PLUGHW");
  local_38 = 0;
  if (pcVar11 == (char *)0x0) {
    local_a8 = "";
    topNode._4_4_ = 0;
  }
  else {
    uStack_140 = 0x10a880;
    iVar7 = atoi(pcVar11);
    topNode._4_4_ = (uint)(iVar7 != 0);
    local_a8 = "";
    if (iVar7 != 0) {
      local_a8 = "plug";
    }
  }
  (alsaApi->baseHostApiRep).info.defaultInputDevice = -1;
  (alsaApi->baseHostApiRep).info.defaultOutputDevice = -1;
  local_80 = -1;
  uStack_140 = 0x10a8db;
  local_50 = alsaApi;
  sVar12 = snd_ctl_card_info_sizeof();
  lVar3 = -(sVar12 + 0xf & 0xfffffffffffffff0);
  pcVar11 = local_138 + lVar3;
  pcVar22 = local_138 + lVar3 + -8;
  alsaDeviceName = pcVar11;
  pcVar22[0] = -3;
  pcVar22[1] = -0x58;
  pcVar22[2] = '\x10';
  pcVar22[3] = '\0';
  pcVar22[4] = '\0';
  pcVar22[5] = '\0';
  pcVar22[6] = '\0';
  pcVar22[7] = '\0';
  memset(pcVar11,0,sVar12);
  pcVar23 = local_138 + lVar3 + -8;
  pcVar23[0] = '\x02';
  pcVar23[1] = -0x57;
  pcVar23[2] = '\x10';
  pcVar23[3] = '\0';
  pcVar23[4] = '\0';
  pcVar23[5] = '\0';
  pcVar23[6] = '\0';
  pcVar23[7] = '\0';
  sVar12 = snd_pcm_info_sizeof();
  lVar4 = -(sVar12 + 0xf & 0xfffffffffffffff0);
  pcVar11 = pcVar11 + lVar4;
  pcVar11[-8] = ' ';
  pcVar11[-7] = -0x57;
  pcVar11[-6] = '\x10';
  pcVar11[-5] = '\0';
  pcVar11[-4] = '\0';
  pcVar11[-3] = '\0';
  pcVar11[-2] = '\0';
  pcVar11[-1] = '\0';
  memset(pcVar11,0,sVar12);
  pcVar11[-8] = '(';
  pcVar11[-7] = -0x57;
  pcVar11[-6] = '\x10';
  pcVar11[-5] = '\0';
  pcVar11[-4] = '\0';
  pcVar11[-3] = '\0';
  pcVar11[-2] = '\0';
  pcVar11[-1] = '\0';
  iVar7 = snd_card_next(&local_80);
  pPVar21 = local_50;
  if (local_80 < 0 || iVar7 != 0) {
    ctl = (snd_ctl_t *)0x1;
    local_48 = (HwDevInfo *)0x0;
    psVar27 = (snd_ctl_t *)0x0;
  }
  else {
    ctl = (snd_ctl_t *)0x1;
    local_38 = 0;
    psVar27 = (snd_ctl_t *)0x0;
    local_48 = (HwDevInfo *)0x0;
    local_88 = pcVar11;
    do {
      local_5c = -1;
      pcVar11[-8] = -0x72;
      pcVar11[-7] = -0x57;
      pcVar11[-6] = '\x10';
      pcVar11[-5] = '\0';
      pcVar11[-4] = '\0';
      pcVar11[-3] = '\0';
      pcVar11[-2] = '\0';
      pcVar11[-1] = '\0';
      snprintf(local_138,0x32,"hw:%d");
      pcVar11[-8] = -100;
      pcVar11[-7] = -0x57;
      pcVar11[-6] = '\x10';
      pcVar11[-5] = '\0';
      pcVar11[-4] = '\0';
      pcVar11[-3] = '\0';
      pcVar11[-2] = '\0';
      pcVar11[-1] = '\0';
      iVar7 = snd_ctl_open(&cardName,local_138,0);
      pcVar19 = cardName;
      pcVar13 = alsaDeviceName;
      if (iVar7 < 0) {
        iVar7 = 6;
      }
      else {
        pcVar11[-8] = -0x49;
        pcVar11[-7] = -0x57;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        snd_ctl_card_info(pcVar19,pcVar13);
        pcVar11[-8] = -0x41;
        pcVar11[-7] = -0x57;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        pcVar13 = (char *)snd_ctl_card_info_get_name(pcVar13);
        builtin_strncpy(local_138 + lVar4 + lVar3 + -8,"Ω\x10",4);
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        paUtilErr_ = PaAlsa_StrDup(pPVar21,(char **)&cardIdx,pcVar13);
        pcVar13 = cardName;
        if (paUtilErr_ < 0) {
          pcVar11[-8] = ',';
          pcVar11[-7] = -0x53;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          PaUtil_DebugPrint(
                           "Expression \'PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo ))\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1291\n"
                           );
          iVar7 = 10;
          local_38 = (ulong)(uint)paUtilErr_;
        }
        else {
          pcVar11[-8] = -0x17;
          pcVar11[-7] = -0x57;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          iVar7 = snd_ctl_pcm_next_device(pcVar13,&local_5c);
          pcVar13 = local_88;
          if (-1 < local_5c && iVar7 == 0) {
            do {
              pcVar19 = local_a8;
              pcVar11[-8] = '+';
              pcVar11[-7] = -0x56;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              snprintf((char *)&local_f8,0x32,"%s%s,%d",pcVar19,local_138);
              iVar7 = local_5c;
              pcVar11[-8] = '6';
              pcVar11[-7] = -0x56;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              snd_pcm_info_set_device(pcVar13,iVar7);
              pcVar11[-8] = '@';
              pcVar11[-7] = -0x56;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              snd_pcm_info_set_subdevice(pcVar13,0);
              pcVar11[-8] = 'M';
              pcVar11[-7] = -0x56;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              snd_pcm_info_set_stream(pcVar13,1);
              pcVar19 = cardName;
              pcVar11[-8] = 'Y';
              pcVar11[-7] = -0x56;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              uVar8 = snd_ctl_pcm_info(pcVar19,pcVar13);
              pcVar11[-8] = 'f';
              pcVar11[-7] = -0x56;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              snd_pcm_info_set_stream(pcVar13,0);
              pcVar19 = cardName;
              pcVar11[-8] = 'r';
              pcVar11[-7] = -0x56;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              uVar9 = snd_ctl_pcm_info(pcVar19);
              if ((int)(uVar9 & uVar8) < 0) {
                iVar7 = 0xb;
              }
              else {
                local_90 = (snd_ctl_t *)CONCAT44(local_90._4_4_,uVar9);
                pcVar11[-8] = -0x7b;
                pcVar11[-7] = -0x56;
                pcVar11[-6] = '\x10';
                pcVar11[-5] = '\0';
                pcVar11[-4] = '\0';
                pcVar11[-3] = '\0';
                pcVar11[-2] = '\0';
                pcVar11[-1] = '\0';
                pbVar14 = (byte *)snd_pcm_info_get_name();
                pbVar6 = _cardIdx;
                bVar1 = *_cardIdx;
                pbVar25 = _cardIdx;
                while (bVar1 != 0) {
                  bVar1 = *pbVar14;
                  pbVar24 = pbVar14;
                  for (; (bVar1 != 0 && (pbVar24 = pbVar24 + 1, bVar1 == *pbVar25));
                      pbVar25 = pbVar25 + 1) {
                    bVar1 = *pbVar24;
                    if ((bVar1 & 0xdf) == 0) {
                      pbVar14 = pbVar24;
                    }
                  }
                  do {
                    bVar1 = *pbVar25;
                    if (bVar1 == 0) break;
                    pbVar25 = pbVar25 + 1;
                  } while (bVar1 != 0x20);
                  bVar1 = *pbVar25;
                }
                pbVar25 = (byte *)"-";
                if (*pbVar14 != 0) {
                  for (; bVar1 = *pbVar14, bVar1 == 0x20; pbVar14 = pbVar14 + 1) {
                  }
                  if ((bVar1 == 0x2d) || (pbVar25 = pbVar14, bVar1 == 0x3a)) {
                    pbVar25 = pbVar14 + (ulong)(pbVar14[1] == 0x20) * 2;
                  }
                }
                _devIdx = (PaAlsaDeviceInfo *)CONCAT44(devIdx_1,uVar8);
                local_40 = psVar27;
                pcVar11[-8] = 'C';
                pcVar11[-7] = -0x55;
                pcVar11[-6] = '\x10';
                pcVar11[-5] = '\0';
                pcVar11[-4] = '\0';
                pcVar11[-3] = '\0';
                pcVar11[-2] = '\0';
                pcVar11[-1] = '\0';
                iVar7 = snprintf((char *)0x0,0,"%s: %s (%s)",pbVar6,pbVar25,&local_f8);
                pPVar2 = pPVar21->allocations;
                pcVar11[-8] = 'W';
                pcVar11[-7] = -0x55;
                pcVar11[-6] = '\x10';
                pcVar11[-5] = '\0';
                pcVar11[-4] = '\0';
                pcVar11[-3] = '\0';
                pcVar11[-2] = '\0';
                pcVar11[-1] = '\0';
                pcVar13 = (char *)PaUtil_GroupAllocateMemory(pPVar2,(long)(iVar7 + 1));
                pbVar14 = _cardIdx;
                if (pcVar13 == (char *)0x0) {
                  pcVar11[-8] = '~';
                  pcVar11[-7] = -0x54;
                  pcVar11[-6] = '\x10';
                  pcVar11[-5] = '\0';
                  pcVar11[-4] = '\0';
                  pcVar11[-3] = '\0';
                  pcVar11[-2] = '\0';
                  pcVar11[-1] = '\0';
                  PaUtil_DebugPrint(
                                   "Expression \'deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1327\n"
                                   );
                  local_38 = 0xffffd8f8;
                  iVar7 = 10;
                  pPVar21 = local_50;
                  psVar27 = local_40;
                  pcVar13 = local_88;
                }
                else {
                  pcVar11[-8] = '}';
                  pcVar11[-7] = -0x55;
                  pcVar11[-6] = '\x10';
                  pcVar11[-5] = '\0';
                  pcVar11[-4] = '\0';
                  pcVar11[-3] = '\0';
                  pcVar11[-2] = '\0';
                  pcVar11[-1] = '\0';
                  snprintf(pcVar13,(long)(iVar7 + 1),"%s: %s (%s)",pbVar14,pbVar25,&local_f8);
                  pHVar26 = local_48;
                  psVar27 = local_40 + 1;
                  if ((local_48 == (HwDevInfo *)0x0) || (ctl < psVar27)) {
                    psVar5 = (snd_ctl_t *)((long)ctl * 2);
                    sVar12 = (long)ctl << 6;
                    pcVar11[-8] = -0x52;
                    pcVar11[-7] = -0x55;
                    pcVar11[-6] = '\x10';
                    pcVar11[-5] = '\0';
                    pcVar11[-4] = '\0';
                    pcVar11[-3] = '\0';
                    pcVar11[-2] = '\0';
                    pcVar11[-1] = '\0';
                    local_48 = (HwDevInfo *)realloc(pHVar26,sVar12);
                    uVar8 = devIdx;
                    if (local_48 == (HwDevInfo *)0x0) {
                      builtin_strncpy(local_138 + lVar4 + lVar3 + -8,"Ƭ\x10",4);
                      pcVar11[-4] = '\0';
                      pcVar11[-3] = '\0';
                      pcVar11[-2] = '\0';
                      pcVar11[-1] = '\0';
                      PaUtil_DebugPrint(
                                       "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1335\n"
                                       );
                      local_38 = 0xffffd8f8;
                      iVar7 = 10;
                      local_48 = (HwDevInfo *)0x0;
                      pPVar21 = local_50;
                      pcVar13 = local_88;
                      ctl = psVar5;
                      goto LAB_0010ac38;
                    }
                  }
                  else {
                    uVar8 = devIdx;
                    psVar5 = ctl;
                  }
                  ctl = psVar5;
                  psVar5 = local_40;
                  pPVar21 = local_50;
                  builtin_strncpy(local_138 + lVar4 + lVar3 + -8,"ޫ\x10",4);
                  pcVar11[-4] = '\0';
                  pcVar11[-3] = '\0';
                  pcVar11[-2] = '\0';
                  pcVar11[-1] = '\0';
                  paUtilErr_ = PaAlsa_StrDup(pPVar21,&local_b8,(char *)&local_f8);
                  if (paUtilErr_ < 0) {
                    pcVar11[-8] = -0x5c;
                    pcVar11[-7] = -0x54;
                    pcVar11[-6] = '\x10';
                    pcVar11[-5] = '\0';
                    pcVar11[-4] = '\0';
                    pcVar11[-3] = '\0';
                    pcVar11[-2] = '\0';
                    pcVar11[-1] = '\0';
                    PaUtil_DebugPrint(
                                     "Expression \'PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1338\n"
                                     );
                    iVar7 = 10;
                    local_38 = (ulong)(uint)paUtilErr_;
                    pPVar21 = local_50;
                    pcVar13 = local_88;
                  }
                  else {
                    local_48[(long)psVar5].alsaName = local_b8;
                    local_48[(long)psVar5].name = pcVar13;
                    local_48[(long)psVar5].isPlug = topNode._4_4_;
                    local_48[(long)psVar5].hasPlayback = ~(uint)local_90 >> 0x1f;
                    local_48[(long)psVar5].hasCapture = ~uVar8 >> 0x1f;
                    iVar7 = 0;
                    pPVar21 = local_50;
                    pcVar13 = local_88;
                  }
                }
              }
LAB_0010ac38:
              pcVar19 = cardName;
              if ((iVar7 != 0xb) && (iVar7 != 0)) goto LAB_0010acf7;
              pcVar11[-8] = 'Y';
              pcVar11[-7] = -0x54;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              iVar7 = snd_ctl_pcm_next_device(pcVar19,&local_5c);
            } while ((iVar7 == 0) && (-1 < local_5c));
          }
          pcVar13 = cardName;
          pcVar11[-8] = -0x12;
          pcVar11[-7] = -0x54;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          snd_ctl_close(pcVar13);
          iVar7 = 0;
        }
      }
LAB_0010acf7:
      if ((iVar7 != 6) && (iVar7 != 0)) goto LAB_0010b2b0;
      pcVar11[-8] = '\r';
      pcVar11[-7] = -0x53;
      pcVar11[-6] = '\x10';
      pcVar11[-5] = '\0';
      pcVar11[-4] = '\0';
      pcVar11[-3] = '\0';
      pcVar11[-2] = '\0';
      pcVar11[-1] = '\0';
      iVar7 = snd_card_next(&local_80);
    } while ((iVar7 == 0) && (-1 < local_80));
  }
  if (_snd_config == 0) {
    pcVar11[-8] = 'b';
    pcVar11[-7] = -0x53;
    pcVar11[-6] = '\x10';
    pcVar11[-5] = '\0';
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    iVar7 = snd_config_update();
    pPVar21 = local_50;
    if (iVar7 < 0) {
      pcVar11[-8] = -0x14;
      pcVar11[-7] = -0x4e;
      pcVar11[-6] = '\x10';
      pcVar11[-5] = '\0';
      pcVar11[-4] = '\0';
      pcVar11[-3] = '\0';
      pcVar11[-2] = '\0';
      pcVar11[-1] = '\0';
      BuildDeviceList_cold_1();
      local_38 = 0xffffd8f1;
      goto LAB_0010b2b0;
    }
  }
  if (_snd_config == 0) {
    pcVar11[-8] = '\x19';
    pcVar11[-7] = -0x4d;
    pcVar11[-6] = '\x10';
    pcVar11[-5] = '\0';
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    __assert_fail("*alsa_snd_config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x54c,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
  }
  pcVar11[-8] = -0x69;
  pcVar11[-7] = -0x53;
  pcVar11[-6] = '\x10';
  pcVar11[-5] = '\0';
  pcVar11[-4] = '\0';
  pcVar11[-3] = '\0';
  pcVar11[-2] = '\0';
  pcVar11[-1] = '\0';
  iVar7 = snd_config_search(_snd_config,"pcm",&local_a0);
  uVar18 = local_a0;
  if (-1 < iVar7) {
    pcVar11[-8] = -0x55;
    pcVar11[-7] = -0x53;
    pcVar11[-6] = '\x10';
    pcVar11[-5] = '\0';
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    lVar15 = snd_config_iterator_first(uVar18);
    pcVar11[-8] = -0x4a;
    pcVar11[-7] = -0x53;
    pcVar11[-6] = '\x10';
    pcVar11[-5] = '\0';
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    lVar16 = snd_config_iterator_next(lVar15);
    uVar18 = local_a0;
    builtin_strncpy(local_138 + lVar4 + lVar3 + -8,"ŭ\x10",4);
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    lVar17 = snd_config_iterator_end(uVar18);
    if (lVar15 == lVar17) {
      bVar28 = true;
    }
    else {
      do {
        local_f8 = "unknown";
        _cardIdx = (byte *)0x0;
        local_40 = psVar27;
        pcVar11[-8] = -7;
        pcVar11[-7] = -0x53;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        uVar18 = snd_config_iterator_entry(lVar15);
        cardName = (char *)0x0;
        pcVar11[-8] = '\x13';
        pcVar11[-7] = -0x52;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        iVar7 = snd_config_search(uVar18,"type",&cardName);
        pcVar13 = cardName;
        lVar15 = lVar16;
        if (iVar7 < 0) {
          if (iVar7 == -2) goto LAB_0010ae4b;
          pcVar11[-8] = '8';
          pcVar11[-7] = -0x51;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          __thread1 = pthread_self();
          pcVar11[-8] = 'J';
          pcVar11[-7] = -0x51;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          iVar10 = pthread_equal(__thread1,paUnixMainThread);
          if (iVar10 != 0) {
            pcVar11[-8] = 'Y';
            pcVar11[-7] = -0x51;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            pcVar13 = (char *)snd_strerror(iVar7);
            pcVar11[-8] = 'i';
            pcVar11[-7] = -0x51;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar7,pcVar13);
          }
          pcVar11[-8] = 'w';
          pcVar11[-7] = -0x51;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          PaUtil_DebugPrint(
                           "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1374\n"
                           );
          local_38 = 0xffffd8f1;
          iVar7 = 10;
          psVar27 = local_40;
        }
        else {
          pcVar11[-8] = '\'';
          pcVar11[-7] = -0x52;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          iVar7 = snd_config_get_string(pcVar13,&local_f8);
          if (iVar7 < 0) {
            pcVar11[-8] = -0x71;
            pcVar11[-7] = -0x50;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            BuildDeviceList_cold_2();
            local_38 = 0xffffd8f1;
            iVar7 = 10;
            psVar27 = local_40;
          }
          else {
LAB_0010ae4b:
            pcVar11[-8] = 'W';
            pcVar11[-7] = -0x52;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            iVar7 = snd_config_get_id(uVar18,&cardIdx);
            pbVar14 = _cardIdx;
            if (iVar7 < 0) {
              pcVar11[-8] = -0x56;
              pcVar11[-7] = -0x50;
              pcVar11[-6] = '\x10';
              pcVar11[-5] = '\0';
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              BuildDeviceList_cold_3();
              local_38 = 0xffffd8f1;
              iVar7 = 10;
              psVar27 = local_40;
            }
            else {
              lVar17 = 0;
              do {
                pcVar13 = *(char **)((long)&IgnorePlugin_ignoredPlugins + lVar17);
                pcVar11[-8] = -0x7f;
                pcVar11[-7] = -0x52;
                pcVar11[-6] = '\x10';
                pcVar11[-5] = '\0';
                pcVar11[-4] = '\0';
                pcVar11[-3] = '\0';
                pcVar11[-2] = '\0';
                pcVar11[-1] = '\0';
                iVar7 = strcmp((char *)pbVar14,pcVar13);
                pPVar21 = local_50;
                if (iVar7 == 0) break;
                bVar28 = lVar17 != 0x48;
                lVar17 = lVar17 + 8;
              } while (bVar28);
              if (iVar7 == 0) {
                iVar7 = 0x17;
                psVar27 = local_40;
              }
              else {
                pPVar2 = local_50->allocations;
                _devIdx = (PaAlsaDeviceInfo *)lVar16;
                pcVar11[-8] = -0x4e;
                pcVar11[-7] = -0x52;
                pcVar11[-6] = '\x10';
                pcVar11[-5] = '\0';
                pcVar11[-4] = '\0';
                pcVar11[-3] = '\0';
                pcVar11[-2] = '\0';
                pcVar11[-1] = '\0';
                sVar12 = strlen((char *)pbVar14);
                pcVar11[-8] = -0x42;
                pcVar11[-7] = -0x52;
                pcVar11[-6] = '\x10';
                pcVar11[-5] = '\0';
                pcVar11[-4] = '\0';
                pcVar11[-3] = '\0';
                pcVar11[-2] = '\0';
                pcVar11[-1] = '\0';
                pcVar13 = (char *)PaUtil_GroupAllocateMemory(pPVar2,sVar12 + 6);
                pbVar14 = _cardIdx;
                if (pcVar13 == (char *)0x0) {
                  builtin_strncpy(local_138 + lVar4 + lVar3 + -8,"˰\x10",4);
                  pcVar11[-4] = '\0';
                  pcVar11[-3] = '\0';
                  pcVar11[-2] = '\0';
                  pcVar11[-1] = '\0';
                  PaUtil_DebugPrint(
                                   "Expression \'alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 6 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1390\n"
                                   );
                  local_38 = 0xffffd8f8;
                  iVar7 = 10;
                  lVar15 = (long)_devIdx;
                  psVar27 = local_40;
                }
                else {
                  builtin_strncpy(local_138 + lVar4 + lVar3 + -8,"֮\x10",4);
                  pcVar11[-4] = '\0';
                  pcVar11[-3] = '\0';
                  pcVar11[-2] = '\0';
                  pcVar11[-1] = '\0';
                  strcpy(pcVar13,(char *)pbVar14);
                  pbVar14 = _cardIdx;
                  pPVar2 = pPVar21->allocations;
                  pcVar11[-8] = -0x1a;
                  pcVar11[-7] = -0x52;
                  pcVar11[-6] = '\x10';
                  pcVar11[-5] = '\0';
                  pcVar11[-4] = '\0';
                  pcVar11[-3] = '\0';
                  pcVar11[-2] = '\0';
                  pcVar11[-1] = '\0';
                  sVar12 = strlen((char *)pbVar14);
                  pcVar11[-8] = -0xe;
                  pcVar11[-7] = -0x52;
                  pcVar11[-6] = '\x10';
                  pcVar11[-5] = '\0';
                  pcVar11[-4] = '\0';
                  pcVar11[-3] = '\0';
                  pcVar11[-2] = '\0';
                  pcVar11[-1] = '\0';
                  pcVar19 = (char *)PaUtil_GroupAllocateMemory(pPVar2,sVar12 + 1);
                  psVar27 = local_40;
                  pbVar14 = _cardIdx;
                  if (pcVar19 == (char *)0x0) {
                    pcVar11[-8] = -0x10;
                    pcVar11[-7] = -0x50;
                    pcVar11[-6] = '\x10';
                    pcVar11[-5] = '\0';
                    pcVar11[-4] = '\0';
                    pcVar11[-3] = '\0';
                    pcVar11[-2] = '\0';
                    pcVar11[-1] = '\0';
                    PaUtil_DebugPrint(
                                     "Expression \'deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1393\n"
                                     );
                    local_38 = 0xffffd8f8;
                    iVar7 = 10;
                    lVar15 = (long)_devIdx;
                  }
                  else {
                    pcVar11[-8] = '\x0e';
                    pcVar11[-7] = -0x51;
                    pcVar11[-6] = '\x10';
                    pcVar11[-5] = '\0';
                    pcVar11[-4] = '\0';
                    pcVar11[-3] = '\0';
                    pcVar11[-2] = '\0';
                    pcVar11[-1] = '\0';
                    strcpy(pcVar19,(char *)pbVar14);
                    pHVar26 = local_48;
                    local_90 = psVar27 + 1;
                    if ((local_48 == (HwDevInfo *)0x0) || (psVar5 = ctl, ctl < local_90)) {
                      psVar5 = (snd_ctl_t *)((long)ctl * 2);
                      sVar12 = (long)ctl << 6;
                      pcVar11[-8] = -0x56;
                      pcVar11[-7] = -0x51;
                      pcVar11[-6] = '\x10';
                      pcVar11[-5] = '\0';
                      pcVar11[-4] = '\0';
                      pcVar11[-3] = '\0';
                      pcVar11[-2] = '\0';
                      pcVar11[-1] = '\0';
                      local_48 = (HwDevInfo *)realloc(pHVar26,sVar12);
                      if (local_48 == (HwDevInfo *)0x0) {
                        pcVar11[-8] = '\x11';
                        pcVar11[-7] = -0x4f;
                        pcVar11[-6] = '\x10';
                        pcVar11[-5] = '\0';
                        pcVar11[-4] = '\0';
                        pcVar11[-3] = '\0';
                        pcVar11[-2] = '\0';
                        pcVar11[-1] = '\0';
                        PaUtil_DebugPrint(
                                         "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1401\n"
                                         );
                        local_38 = 0xffffd8f8;
                        iVar7 = 10;
                        local_48 = (HwDevInfo *)0x0;
                        lVar15 = (long)_devIdx;
                        psVar27 = local_90;
                        ctl = psVar5;
                        goto LAB_0010b055;
                      }
                    }
                    ctl = psVar5;
                    if (predefinedNames[0].alsaName == (char *)0x0) {
LAB_0010aff8:
                      pHVar26 = (HwDevInfo *)0x0;
                    }
                    else {
                      builtin_strncpy(local_138 + lVar4 + lVar3 + -8,"ү\x10",4);
                      pcVar11[-4] = '\0';
                      pcVar11[-3] = '\0';
                      pcVar11[-2] = '\0';
                      pcVar11[-1] = '\0';
                      iVar7 = strcmp(pcVar13,predefinedNames[0].alsaName);
                      pHVar26 = predefinedNames;
                      if (iVar7 != 0) {
                        pHVar26 = predefinedNames;
                        do {
                          __s2 = pHVar26[1].alsaName;
                          if (__s2 == (char *)0x0) goto LAB_0010aff8;
                          pcVar11[-8] = -0x12;
                          pcVar11[-7] = -0x51;
                          pcVar11[-6] = '\x10';
                          pcVar11[-5] = '\0';
                          pcVar11[-4] = '\0';
                          pcVar11[-3] = '\0';
                          pcVar11[-2] = '\0';
                          pcVar11[-1] = '\0';
                          iVar7 = strcmp(pcVar13,__s2);
                          pHVar26 = pHVar26 + 1;
                        } while (iVar7 != 0);
                      }
                    }
                    local_48[(long)local_40].alsaName = pcVar13;
                    local_48[(long)local_40].name = pcVar19;
                    local_48[(long)local_40].isPlug = 1;
                    if (pHVar26 == (HwDevInfo *)0x0) {
                      local_48[(long)local_40].hasPlayback = 1;
                      local_48[(long)local_40].hasCapture = 1;
                    }
                    else {
                      local_48[(long)local_40].hasPlayback = pHVar26->hasPlayback;
                      local_48[(long)local_40].hasCapture = pHVar26->hasCapture;
                    }
                    iVar7 = 0;
                    lVar15 = (long)_devIdx;
                    psVar27 = local_90;
                  }
                }
              }
            }
          }
        }
LAB_0010b055:
        if ((iVar7 != 0x17) && (iVar7 != 0)) goto LAB_0010b132;
        pcVar11[-8] = 'j';
        pcVar11[-7] = -0x50;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        lVar16 = snd_config_iterator_next(lVar15);
        uVar18 = local_a0;
        pcVar11[-8] = 'y';
        pcVar11[-7] = -0x50;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        lVar17 = snd_config_iterator_end(uVar18);
      } while (lVar15 != lVar17);
      iVar7 = 0;
LAB_0010b132:
      bVar28 = iVar7 == 0;
    }
    pPVar21 = local_50;
    if (!bVar28) goto LAB_0010b2b0;
  }
  pPVar2 = pPVar21->allocations;
  pcVar11[-8] = '[';
  pcVar11[-7] = -0x4f;
  pcVar11[-6] = '\x10';
  pcVar11[-5] = '\0';
  pcVar11[-4] = '\0';
  pcVar11[-3] = '\0';
  pcVar11[-2] = '\0';
  pcVar11[-1] = '\0';
  ppPVar20 = (PaDeviceInfo **)PaUtil_GroupAllocateMemory(pPVar2,(long)psVar27 * 8);
  (pPVar21->baseHostApiRep).deviceInfos = ppPVar20;
  if (ppPVar20 == (PaDeviceInfo **)0x0) {
    pcVar13 = 
    "Expression \'baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1427\n"
    ;
  }
  else {
    pPVar2 = pPVar21->allocations;
    pcVar11[-8] = '\x7f';
    pcVar11[-7] = -0x4f;
    pcVar11[-6] = '\x10';
    pcVar11[-5] = '\0';
    pcVar11[-4] = '\0';
    pcVar11[-3] = '\0';
    pcVar11[-2] = '\0';
    pcVar11[-1] = '\0';
    devInfo = (PaAlsaDeviceInfo *)PaUtil_GroupAllocateMemory(pPVar2,(long)psVar27 * 0x60);
    if (devInfo != (PaAlsaDeviceInfo *)0x0) {
      local_60 = 0;
      devInfo_00 = devInfo;
      local_40 = psVar27;
      pHVar26 = local_48;
      deviceHwInfo = local_48;
      for (; _devIdx = devInfo_00, local_48 = deviceHwInfo, psVar27 != (snd_ctl_t *)0x0;
          psVar27 = psVar27 + -1) {
        pcVar13 = pHVar26->name;
        pcVar11[-8] = -0x44;
        pcVar11[-7] = -0x4f;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        iVar7 = strcmp(pcVar13,"dmix");
        iVar10 = 0x2a;
        if (iVar7 != 0) {
          builtin_strncpy(local_138 + lVar4 + lVar3 + -8,"ձ\x10",4);
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          iVar7 = strcmp(pcVar13,"default");
          pPVar21 = local_50;
          uVar8 = local_7c;
          if (iVar7 != 0) {
            pcVar11[-8] = -0x11;
            pcVar11[-7] = -0x4f;
            pcVar11[-6] = '\x10';
            pcVar11[-5] = '\0';
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            FillInDevInfo(pPVar21,pHVar26,uVar8,devInfo,&local_60);
            paUtilErr_ = 0;
            iVar10 = 0;
          }
        }
        if ((iVar10 != 0x2a) && (iVar10 != 0)) goto LAB_0010b2b0;
        pHVar26 = pHVar26 + 1;
        devInfo = devInfo + 1;
        devInfo_00 = _devIdx;
        deviceHwInfo = local_48;
      }
      if (local_40 <= (snd_ctl_t *)(long)local_60) {
        *(code **)(pcVar11 + -8) = CloseStream;
        __assert_fail("devIdx < numDeviceNames",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x5ad,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
      }
      do {
        pcVar13 = deviceHwInfo->name;
        pcVar11[-8] = 'L';
        pcVar11[-7] = -0x4e;
        pcVar11[-6] = '\x10';
        pcVar11[-5] = '\0';
        pcVar11[-4] = '\0';
        pcVar11[-3] = '\0';
        pcVar11[-2] = '\0';
        pcVar11[-1] = '\0';
        iVar7 = strcmp(pcVar13,"dmix");
        if (iVar7 == 0) {
LAB_0010b264:
          pPVar21 = local_50;
          uVar8 = local_7c;
          pcVar11[-8] = 'z';
          pcVar11[-7] = -0x4e;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          FillInDevInfo(pPVar21,deviceHwInfo,uVar8,devInfo_00,&local_60);
          paUtilErr_ = 0;
          iVar10 = 0;
        }
        else {
          pcVar11[-8] = '[';
          pcVar11[-7] = -0x4e;
          pcVar11[-6] = '\x10';
          pcVar11[-5] = '\0';
          pcVar11[-4] = '\0';
          pcVar11[-3] = '\0';
          pcVar11[-2] = '\0';
          pcVar11[-1] = '\0';
          iVar7 = strcmp(pcVar13,"default");
          iVar10 = 0x2f;
          if (iVar7 == 0) goto LAB_0010b264;
        }
        pHVar26 = local_48;
        if ((iVar10 != 0x2f) && (iVar10 != 0)) goto LAB_0010b2b0;
        deviceHwInfo = deviceHwInfo + 1;
        devInfo_00 = devInfo_00 + 1;
        local_40 = local_40 + -1;
      } while (local_40 != (snd_ctl_t *)0x0);
      pcVar11[-8] = -0x5a;
      pcVar11[-7] = -0x4e;
      pcVar11[-6] = '\x10';
      pcVar11[-5] = '\0';
      pcVar11[-4] = '\0';
      pcVar11[-3] = '\0';
      pcVar11[-2] = '\0';
      pcVar11[-1] = '\0';
      free(pHVar26);
      (local_50->baseHostApiRep).info.deviceCount = local_60;
      goto LAB_0010b2b0;
    }
    pcVar13 = 
    "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1431\n"
    ;
  }
  builtin_strncpy(local_138 + lVar4 + lVar3 + -8,"ڲ\x10",4);
  pcVar11[-4] = '\0';
  pcVar11[-3] = '\0';
  pcVar11[-2] = '\0';
  pcVar11[-1] = '\0';
  PaUtil_DebugPrint(pcVar13);
  local_38 = 0xffffd8f8;
LAB_0010b2b0:
  return (PaError)local_38;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi )
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* These two will be set to the first working input and output device, respectively */
    baseApi->info.defaultInputDevice = paNoDevice;
    baseApi->info.defaultOutputDevice = paNoDevice;

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[50];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    assert( devIdx < numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    free( hwDevInfos );

    baseApi->info.deviceCount = devIdx;   /* Number of successfully queried devices */

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    return result;

error:
    /* No particular action */
    goto end;
}